

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope::getUri(Scope *this,XMLCh *prefix)

{
  char16_t *local_30;
  char16_t *local_20;
  XMLCh *uri;
  XMLCh *prefix_local;
  Scope *this_local;
  
  local_20 = (char16_t *)0x0;
  if (this->fPrefixHash == (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) {
    if (this->fBaseScopeWithBindings != (Scope *)0x0) {
      local_20 = getUri(this->fBaseScopeWithBindings,prefix);
    }
  }
  else {
    local_20 = RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get(this->fPrefixHash,prefix);
  }
  if (local_20 == (char16_t *)0x0) {
    local_30 = (char16_t *)0x0;
  }
  else {
    local_30 = local_20;
  }
  return local_30;
}

Assistant:

const XMLCh* DOMNormalizer::InScopeNamespaces::Scope::getUri(const XMLCh *prefix) const {
    const XMLCh* uri = 0;

    if(fPrefixHash) {
        uri = fPrefixHash->get(prefix);
    }
    else if(fBaseScopeWithBindings) {
        uri = fBaseScopeWithBindings->getUri(prefix);
    }

    return uri ? uri : 0;
}